

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseConfig.cpp
# Opt level: O2

void __thiscall xmrig::BaseConfig::BaseConfig(BaseConfig *this)

{
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__BaseConfig_001baab0;
  this->m_autoSave = true;
  this->m_background = false;
  this->m_dryRun = false;
  this->m_syslog = false;
  this->m_upgrade = false;
  this->m_watch = true;
  Http::Http(&this->m_http);
  Pools::Pools(&this->m_pools);
  (this->m_userAgent).m_data = (char *)0x0;
  (this->m_userAgent).m_size = 0;
  (this->m_logFile).m_data = (char *)0x0;
  (this->m_logFile).m_size = 0;
  (this->m_fileName).m_data = (char *)0x0;
  (this->m_fileName).m_size = 0;
  (this->m_apiWorkerId).m_data = (char *)0x0;
  (this->m_apiWorkerId).m_size = 0;
  (this->m_apiId).m_data = (char *)0x0;
  (this->m_apiId).m_size = 0;
  this->m_printTime = 0x3c;
  this->m_version = 0;
  return;
}

Assistant:

xmrig::BaseConfig::BaseConfig()
{
}